

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O0

void __thiscall amrex::StateData::printTimeInterval(StateData *this,ostream *os)

{
  ostream *poVar1;
  ostream *in_RSI;
  long in_RDI;
  
  poVar1 = std::operator<<(in_RSI,'[');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(double *)(in_RDI + 0xb8));
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(double *)(in_RDI + 0xc0));
  poVar1 = std::operator<<(poVar1,"] [");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(double *)(in_RDI + 0xa8));
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(double *)(in_RDI + 0xb0));
  poVar1 = std::operator<<(poVar1,']');
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void
StateData::printTimeInterval (std::ostream &os) const
{
    os << '['
       << old_time.start
       << ' '
       << old_time.stop
       << "] ["
       << new_time.start
       << ' '
       << new_time.stop
       << ']'
       << '\n';
}